

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes_modes.c
# Opt level: O0

int aes_cfb_decrypt(uchar *ibuf,uchar *obuf,int len,uchar *iv,aes_encrypt_ctx *ctx)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  uint local_5c;
  uint local_54;
  uint8_t t_3;
  uint8_t t_2;
  uint32_t t_1;
  uint uStack_40;
  uint8_t t;
  int nb;
  int b_pos;
  int cnt;
  aes_encrypt_ctx *ctx_local;
  uchar *iv_local;
  uint *puStack_20;
  int len_local;
  uchar *obuf_local;
  uchar *ibuf_local;
  
  nb = 0;
  uStack_40 = (uint)(ctx->inf).b[2];
  puStack_20 = (uint *)obuf;
  obuf_local = ibuf;
  if (uStack_40 != 0) {
    for (; (int)uStack_40 < 0x10 && nb < len; nb = nb + 1) {
      bVar1 = *obuf_local;
      *(byte *)puStack_20 = bVar1 ^ iv[(int)uStack_40];
      iv[(int)uStack_40] = bVar1;
      uStack_40 = uStack_40 + 1;
      puStack_20 = (uint *)((long)puStack_20 + 1);
      obuf_local = obuf_local + 1;
    }
    if (uStack_40 == 0x10) {
      local_54 = 0;
    }
    else {
      local_54 = uStack_40;
    }
    uStack_40 = local_54;
  }
  if (len - nb >> 4 != 0) {
    if (((((ulong)obuf_local & 3) == 0) && (((ulong)puStack_20 & 3) == 0)) && (((ulong)iv & 3) == 0)
       ) {
      for (; nb + 0x10 <= len; nb = nb + 0x10) {
        if (uStack_40 != 0) {
          __assert_fail("b_pos == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibAesgm/aes_modes.c"
                        ,0x294,
                        "int aes_cfb_decrypt(const unsigned char *, unsigned char *, int, unsigned char *, aes_encrypt_ctx *)"
                       );
        }
        iVar3 = aes_encrypt(iv,iv,ctx);
        if (iVar3 != 0) {
          return 1;
        }
        uVar2 = *(uint *)obuf_local;
        *puStack_20 = uVar2 ^ *(uint *)iv;
        *(uint *)iv = uVar2;
        uVar2 = *(uint *)(obuf_local + 4);
        puStack_20[1] = uVar2 ^ *(uint *)(iv + 4);
        *(uint *)(iv + 4) = uVar2;
        uVar2 = *(uint *)(obuf_local + 8);
        puStack_20[2] = uVar2 ^ *(uint *)(iv + 8);
        *(uint *)(iv + 8) = uVar2;
        uVar2 = *(uint *)(obuf_local + 0xc);
        puStack_20[3] = uVar2 ^ *(uint *)(iv + 0xc);
        *(uint *)(iv + 0xc) = uVar2;
        obuf_local = obuf_local + 0x10;
        puStack_20 = puStack_20 + 4;
      }
    }
    else {
      for (; nb + 0x10 <= len; nb = nb + 0x10) {
        if (uStack_40 != 0) {
          __assert_fail("b_pos == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibAesgm/aes_modes.c"
                        ,0x2a4,
                        "int aes_cfb_decrypt(const unsigned char *, unsigned char *, int, unsigned char *, aes_encrypt_ctx *)"
                       );
        }
        iVar3 = aes_encrypt(iv,iv,ctx);
        if (iVar3 != 0) {
          return 1;
        }
        bVar1 = *obuf_local;
        *(byte *)puStack_20 = bVar1 ^ *iv;
        *iv = bVar1;
        bVar1 = obuf_local[1];
        *(byte *)((long)puStack_20 + 1) = bVar1 ^ iv[1];
        iv[1] = bVar1;
        bVar1 = obuf_local[2];
        *(byte *)((long)puStack_20 + 2) = bVar1 ^ iv[2];
        iv[2] = bVar1;
        bVar1 = obuf_local[3];
        *(byte *)((long)puStack_20 + 3) = bVar1 ^ iv[3];
        iv[3] = bVar1;
        bVar1 = obuf_local[4];
        *(byte *)(puStack_20 + 1) = bVar1 ^ iv[4];
        iv[4] = bVar1;
        bVar1 = obuf_local[5];
        *(byte *)((long)puStack_20 + 5) = bVar1 ^ iv[5];
        iv[5] = bVar1;
        bVar1 = obuf_local[6];
        *(byte *)((long)puStack_20 + 6) = bVar1 ^ iv[6];
        iv[6] = bVar1;
        bVar1 = obuf_local[7];
        *(byte *)((long)puStack_20 + 7) = bVar1 ^ iv[7];
        iv[7] = bVar1;
        bVar1 = obuf_local[8];
        *(byte *)(puStack_20 + 2) = bVar1 ^ iv[8];
        iv[8] = bVar1;
        bVar1 = obuf_local[9];
        *(byte *)((long)puStack_20 + 9) = bVar1 ^ iv[9];
        iv[9] = bVar1;
        bVar1 = obuf_local[10];
        *(byte *)((long)puStack_20 + 10) = bVar1 ^ iv[10];
        iv[10] = bVar1;
        bVar1 = obuf_local[0xb];
        *(byte *)((long)puStack_20 + 0xb) = bVar1 ^ iv[0xb];
        iv[0xb] = bVar1;
        bVar1 = obuf_local[0xc];
        *(byte *)(puStack_20 + 3) = bVar1 ^ iv[0xc];
        iv[0xc] = bVar1;
        bVar1 = obuf_local[0xd];
        *(byte *)((long)puStack_20 + 0xd) = bVar1 ^ iv[0xd];
        iv[0xd] = bVar1;
        bVar1 = obuf_local[0xe];
        *(byte *)((long)puStack_20 + 0xe) = bVar1 ^ iv[0xe];
        iv[0xe] = bVar1;
        bVar1 = obuf_local[0xf];
        *(byte *)((long)puStack_20 + 0xf) = bVar1 ^ iv[0xf];
        iv[0xf] = bVar1;
        obuf_local = obuf_local + 0x10;
        puStack_20 = puStack_20 + 4;
      }
    }
  }
  while( true ) {
    if (len <= nb) {
      (ctx->inf).b[2] = (uint8_t)uStack_40;
      return 0;
    }
    if ((uStack_40 == 0) && (iVar3 = aes_encrypt(iv,iv,ctx), iVar3 != 0)) break;
    for (; nb < len && (int)uStack_40 < 0x10; nb = nb + 1) {
      bVar1 = *obuf_local;
      *(byte *)puStack_20 = bVar1 ^ iv[(int)uStack_40];
      iv[(int)uStack_40] = bVar1;
      uStack_40 = uStack_40 + 1;
      puStack_20 = (uint *)((long)puStack_20 + 1);
      obuf_local = obuf_local + 1;
    }
    if (uStack_40 == 0x10) {
      local_5c = 0;
    }
    else {
      local_5c = uStack_40;
    }
    uStack_40 = local_5c;
  }
  return 1;
}

Assistant:

AES_RETURN aes_cfb_decrypt(const unsigned char *ibuf, unsigned char *obuf,
                    int len, unsigned char *iv, aes_encrypt_ctx ctx[1])
{   int cnt = 0, b_pos = (int)ctx->inf.b[2], nb;

    if(b_pos)           /* complete any partial block   */
    {   uint8_t t;

        while(b_pos < AES_BLOCK_SIZE && cnt < len)
        {
            t = *ibuf++;
            *obuf++ = t ^ iv[b_pos];
            iv[b_pos++] = t;
            cnt++;
        }

        b_pos = (b_pos == AES_BLOCK_SIZE ? 0 : b_pos);
    }

    if((nb = (len - cnt) >> 4) != 0)    /* process whole blocks */
    {
#if defined( USE_VIA_ACE_IF_PRESENT )

        if(ctx->inf.b[1] == 0xff)
        {   int m;
            uint8_t *ksp = (uint8_t*)(ctx->ks), *ivp = iv;
            aligned_auto(uint8_t, liv, AES_BLOCK_SIZE, 16);
            via_cwd(cwd, hybrid, dec, 2 * ctx->inf.b[0] - 192);

            if(ALIGN_OFFSET( ctx, 16 ))
                return EXIT_FAILURE;

            if(ALIGN_OFFSET( iv, 16 ))   /* ensure an aligned iv */
            {
                ivp = liv;
                memcpy(liv, iv, AES_BLOCK_SIZE);
            }

            if(!ALIGN_OFFSET( ibuf, 16 ) && !ALIGN_OFFSET( obuf, 16 ))
            {
                via_cfb_op6(ksp, cwd, ibuf, obuf, nb, ivp);
                ibuf += nb * AES_BLOCK_SIZE;
                obuf += nb * AES_BLOCK_SIZE;
                cnt  += nb * AES_BLOCK_SIZE;
            }
            else    /* input, output or both are unaligned  */
            {   aligned_auto(uint8_t, buf, BFR_BLOCKS * AES_BLOCK_SIZE, 16);
                uint8_t *ip, *op;

                while(nb)
                {
                    m = (nb > BFR_BLOCKS ? BFR_BLOCKS : nb), nb -= m;

                    ip = (ALIGN_OFFSET( ibuf, 16 ) ? buf : ibuf);
                    op = (ALIGN_OFFSET( obuf, 16 ) ? buf : obuf);

                    if(ip != ibuf)  /* input buffer is not aligned */
                        memcpy(buf, ibuf, m * AES_BLOCK_SIZE);

                    via_cfb_op6(ksp, cwd, ip, op, m, ivp);

                    if(op != obuf)  /* output buffer is not aligned */
                        memcpy(obuf, buf, m * AES_BLOCK_SIZE);

                    ibuf += m * AES_BLOCK_SIZE;
                    obuf += m * AES_BLOCK_SIZE;
                    cnt  += m * AES_BLOCK_SIZE;
                }
            }

            if(ivp != iv)
                memcpy(iv, ivp, AES_BLOCK_SIZE);
        }
#else
# ifdef FAST_BUFFER_OPERATIONS
        if(!ALIGN_OFFSET( ibuf, 4 ) && !ALIGN_OFFSET( obuf, 4 ) &&!ALIGN_OFFSET( iv, 4 ))
            while(cnt + AES_BLOCK_SIZE <= len)
            {   uint32_t t;

                assert(b_pos == 0);
                if(aes_encrypt(iv, iv, ctx) != EXIT_SUCCESS)
                    return EXIT_FAILURE;
                t = lp32(ibuf)[0], lp32(obuf)[0] = t ^ lp32(iv)[0], lp32(iv)[0] = t;
                t = lp32(ibuf)[1], lp32(obuf)[1] = t ^ lp32(iv)[1], lp32(iv)[1] = t;
                t = lp32(ibuf)[2], lp32(obuf)[2] = t ^ lp32(iv)[2], lp32(iv)[2] = t;
                t = lp32(ibuf)[3], lp32(obuf)[3] = t ^ lp32(iv)[3], lp32(iv)[3] = t;
                ibuf += AES_BLOCK_SIZE;
                obuf += AES_BLOCK_SIZE;
                cnt  += AES_BLOCK_SIZE;
            }
        else
# endif
            while(cnt + AES_BLOCK_SIZE <= len)
            {   uint8_t t;

                assert(b_pos == 0);
                if(aes_encrypt(iv, iv, ctx) != EXIT_SUCCESS)
                    return EXIT_FAILURE;
                t = ibuf[ 0], obuf[ 0] = t ^ iv[ 0], iv[ 0] = t;
                t = ibuf[ 1], obuf[ 1] = t ^ iv[ 1], iv[ 1] = t;
                t = ibuf[ 2], obuf[ 2] = t ^ iv[ 2], iv[ 2] = t;
                t = ibuf[ 3], obuf[ 3] = t ^ iv[ 3], iv[ 3] = t;
                t = ibuf[ 4], obuf[ 4] = t ^ iv[ 4], iv[ 4] = t;
                t = ibuf[ 5], obuf[ 5] = t ^ iv[ 5], iv[ 5] = t;
                t = ibuf[ 6], obuf[ 6] = t ^ iv[ 6], iv[ 6] = t;
                t = ibuf[ 7], obuf[ 7] = t ^ iv[ 7], iv[ 7] = t;
                t = ibuf[ 8], obuf[ 8] = t ^ iv[ 8], iv[ 8] = t;
                t = ibuf[ 9], obuf[ 9] = t ^ iv[ 9], iv[ 9] = t;
                t = ibuf[10], obuf[10] = t ^ iv[10], iv[10] = t;
                t = ibuf[11], obuf[11] = t ^ iv[11], iv[11] = t;
                t = ibuf[12], obuf[12] = t ^ iv[12], iv[12] = t;
                t = ibuf[13], obuf[13] = t ^ iv[13], iv[13] = t;
                t = ibuf[14], obuf[14] = t ^ iv[14], iv[14] = t;
                t = ibuf[15], obuf[15] = t ^ iv[15], iv[15] = t;
                ibuf += AES_BLOCK_SIZE;
                obuf += AES_BLOCK_SIZE;
                cnt  += AES_BLOCK_SIZE;
            }
#endif
    }

    while(cnt < len)
    {   uint8_t t;

        if(!b_pos && aes_encrypt(iv, iv, ctx) != EXIT_SUCCESS)
            return EXIT_FAILURE;

        while(cnt < len && b_pos < AES_BLOCK_SIZE)
        {
            t = *ibuf++;
            *obuf++ = t ^ iv[b_pos];
            iv[b_pos++] = t;
            cnt++;
        }

        b_pos = (b_pos == AES_BLOCK_SIZE ? 0 : b_pos);
    }

    ctx->inf.b[2] = (uint8_t)b_pos;
    return EXIT_SUCCESS;
}